

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall tonk::gateway::HTTPRequester::ContinueReadingBody(HTTPRequester *this)

{
  transfer_exactly_t completion_condition;
  HTTPRequester *this_00;
  size_type sVar1;
  uchar *puVar2;
  char *pcVar3;
  type s;
  transfer_exactly_t handler;
  long in_RDI;
  uint readCount;
  Result success;
  size_t availBytes;
  size_t priorBytes;
  istream is;
  size_t in_stack_fffffffffffffe48;
  Result *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 uVar4;
  size_type in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  uint bytes;
  char *response;
  ulong in_stack_fffffffffffffe80;
  uint httpResponseCode;
  Result *in_stack_fffffffffffffe88;
  char local_120 [288];
  
  if ((*(byte *)(in_RDI + 0x1a0) & 1) == 0) {
    std::istream::istream(local_120,(streambuf *)(in_RDI + 0xf8));
    do {
      this_00 = (HTTPRequester *)std::streambuf::in_avail();
      if ((long)this_00 < 1) break;
      sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x158));
      in_stack_fffffffffffffe88 = (Result *)std::streambuf::in_avail();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a27d9);
      std::istream::read(local_120,(long)(puVar2 + sVar1));
      in_stack_fffffffffffffe80 = *(ulong *)(in_RDI + 0x170);
      sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x158));
    } while (sVar1 < in_stack_fffffffffffffe80);
    httpResponseCode = (uint)(in_stack_fffffffffffffe80 >> 0x20);
    response = *(char **)(in_RDI + 0x170);
    pcVar3 = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (in_RDI + 0x158));
    if (pcVar3 < response) {
      uVar4 = *(undefined4 *)(in_RDI + 0x170);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x158));
      *(int *)(in_RDI + 400) = *(int *)(in_RDI + 400) + 1;
      s = std::
          unique_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
          ::operator*((unique_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
                       *)in_stack_fffffffffffffe50);
      handler = asio::transfer_exactly(in_stack_fffffffffffffe48);
      completion_condition.size_._4_4_ = in_stack_fffffffffffffe74;
      completion_condition.size_._0_4_ = in_stack_fffffffffffffe70;
      asio::
      async_read<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,std::allocator<char>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>
                (s,(basic_streambuf<std::allocator<char>_> *)
                   CONCAT44(uVar4,in_stack_fffffffffffffe60),completion_condition,
                 (anon_class_8_1_8991fb9c_for_handler_ *)handler.size_);
    }
    else {
      Result::Success();
      bytes = *(uint *)(in_RDI + 0x178);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a289a);
      OnDone(this_00,in_stack_fffffffffffffe88,httpResponseCode,response,bytes);
      Result::~Result(in_stack_fffffffffffffe50);
    }
    std::istream::~istream(local_120);
  }
  return;
}

Assistant:

void HTTPRequester::ContinueReadingBody()
{
    if (Done) {
        return;
    }

    std::istream is(&TCPStreamBuf);

    while (TCPStreamBuf.in_avail() > 0)
    {
        // Append bytes from the multiple buffers backing TCPStreamBuf
        // into the single contiguous buffer of body content we will return
        const size_t priorBytes = BodyContent.size();
        const size_t availBytes = (size_t)TCPStreamBuf.in_avail();
        BodyContent.resize(priorBytes + availBytes);
        is.read((char*)BodyContent.data() + priorBytes, availBytes);

        // If we are done:
        if (ContentLength <= BodyContent.size()) {
            break;
        }
    }

    // If we are done:
    if (ContentLength <= BodyContent.size())
    {
        const Result success = Result::Success();
        OnDone(success, HTTPStatusCode, (char*)BodyContent.data(), (unsigned)ContentLength);
        return;
    }

    // Read enough to fill the BodyContent buffer
    unsigned readCount = static_cast<unsigned>(ContentLength - BodyContent.size());

    // Request to read exactly the amount left in the body
    ++AsyncRefs;
    asio::async_read(
        *Socket_TCP,
        TCPStreamBuf,
        asio::transfer_exactly(readCount),
        [this](const asio::error_code& ec, size_t bytes)
    {
        --AsyncRefs;

        // If the socket was closed:
        if (bytes <= 0 || ec)
        {
            Result result = Result("Connection closed", ec.message(), ErrorType::Asio, ec.value());
            OnDone(result);
            return;
        }

        ContinueReadingBody();
    });
}